

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O0

int mk_stream_in_release(mk_stream_input *in)

{
  mk_stream_input *in_local;
  
  if (in->cb_finished != (_func_void_mk_stream_input_ptr *)0x0) {
    (*in->cb_finished)(in);
  }
  mk_stream_input_unlink(in);
  if (in->dynamic == 1) {
    mk_mem_free(in);
  }
  return 0;
}

Assistant:

int mk_stream_in_release(struct mk_stream_input *in)
{
    if (in->cb_finished) {
        in->cb_finished(in);
    }

    mk_stream_input_unlink(in);
    if (in->dynamic == MK_TRUE) {
        mk_mem_free(in);
    }

    return 0;
}